

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator~(CharClass<char> *__return_storage_ptr__,CharClass<char> *this)

{
  undefined8 in_RAX;
  pointer pRVar1;
  char last_end;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  CharClass(__return_storage_ptr__);
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uStack_38._0_6_ = CONCAT15(1,(undefined5)uStack_38);
  if ((pRVar1 != (this->m_ranges).
                 super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) && (pRVar1->m_start == '\x01')) {
    uStack_38._0_6_ = CONCAT15(pRVar1->m_end,(undefined5)uStack_38);
    pRVar1 = pRVar1 + 1;
  }
  if (pRVar1 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uStack_38._0_7_ = CONCAT16(pRVar1->m_start,(undefined6)uStack_38);
      std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
      emplace_back<char&,char>
                ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
                 &__return_storage_ptr__->m_ranges,(char *)((long)&uStack_38 + 5),
                 (char *)((long)&uStack_38 + 6));
      uStack_38._0_6_ = CONCAT15(pRVar1->m_end,(undefined5)uStack_38);
      pRVar1 = pRVar1 + 1;
    } while (pRVar1 != (this->m_ranges).
                       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (uStack_38._5_1_ != -1) {
    uStack_38 = CONCAT17(0xff,(undefined7)uStack_38);
    std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
    emplace_back<char&,char>
              ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
               &__return_storage_ptr__->m_ranges,(char *)((long)&uStack_38 + 5),
               (char *)((long)&uStack_38 + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }